

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O0

void __thiscall
CommandDrawInventoryBar::Draw
          (CommandDrawInventoryBar *this,SBarInfoMainBlock *block,DSBarInfo *statusBar)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  SBarInfoCoordinate SVar4;
  SBarInfoCoordinate SVar5;
  int iVar6;
  AInventory *pAVar7;
  AInventory *pAVar8;
  FTexture *pFVar9;
  double dVar10;
  int local_334;
  int local_324;
  int local_30c;
  int local_2f8;
  int local_2f4;
  int local_2d4;
  int local_2c4;
  int local_2ac;
  int local_294;
  int local_26c;
  int local_25c;
  byte local_239;
  int local_ec;
  int local_dc;
  int yOffset_1;
  int offset_1;
  int yOffset;
  int offset;
  SBarInfoCoordinate local_4c;
  SBarInfoCoordinate local_48;
  SBarInfoCoordinate ry;
  SBarInfoCoordinate rx;
  uint i;
  AInventory *item;
  double bgalpha;
  int spacing;
  DSBarInfo *statusBar_local;
  SBarInfoMainBlock *block_local;
  CommandDrawInventoryBar *this_local;
  
  iVar2 = GetCounterSpacing(this,statusBar);
  item = (AInventory *)SBarInfoMainBlock::Alpha(block);
  if ((this->translucent & 1U) != 0) {
    item = (AInventory *)((double)item * 0.59375);
  }
  ry = (SBarInfoCoordinate)0x0;
  pAVar7 = DBaseStatusBar::ValidateInvFirst(&statusBar->super_DBaseStatusBar,this->size);
  TObjPtr<AInventory>::operator=(&((statusBar->super_DBaseStatusBar).CPlayer)->mo->InvFirst,pAVar7);
  bVar1 = TObjPtr<AInventory>::operator!=
                    (&((statusBar->super_DBaseStatusBar).CPlayer)->mo->InvFirst,(AInventory *)0x0);
  if ((bVar1) || ((this->alwaysShow & 1U) != 0)) {
    _rx = ::TObjPtr::operator_cast_to_AInventory_
                    ((TObjPtr *)&((statusBar->super_DBaseStatusBar).CPlayer)->mo->InvFirst);
    ry = (SBarInfoCoordinate)0x0;
    while( true ) {
      bVar1 = false;
      if (_rx != (AInventory *)0x0) {
        bVar1 = (uint)ry < this->size;
      }
      if (!bVar1) break;
      if ((this->vertical & 1U) == 0) {
        local_dc = (int)ry * iVar2;
      }
      else {
        local_dc = 0;
      }
      local_48 = SBarInfoCoordinate::operator+(&this->x,local_dc);
      if ((this->vertical & 1U) == 0) {
        local_ec = 0;
      }
      else {
        local_ec = (int)ry * iVar2;
      }
      local_4c = SBarInfoCoordinate::operator+(&this->y,local_ec);
      if ((this->noArtibox & 1U) == 0) {
        pFVar9 = FImageCollection::operator[](&statusBar->Images,statusBar->invBarOffset);
        SVar5 = local_48;
        SVar4 = local_4c;
        iVar6 = SBarInfoMainBlock::XOffset(block);
        iVar3 = SBarInfoMainBlock::YOffset(block);
        bVar1 = SBarInfoMainBlock::FullScreenOffsets(block);
        DSBarInfo::DrawGraphic
                  (statusBar,pFVar9,SVar5,SVar4,iVar6,iVar3,(double)item,bVar1,false,false,0,false,
                   -1,-1,nulclip,false);
      }
      if (this->style != STYLE_Strife) {
        pFVar9 = FTextureManager::operator()(&TexMan,(FTextureID)(_rx->Icon).texnum,false);
        iVar6 = 0;
        if (this->style == STYLE_HexenStrict) {
          iVar6 = 2;
        }
        SVar4 = SBarInfoCoordinate::operator-(&local_48,iVar6);
        SVar5 = SBarInfoCoordinate::operator-(&local_4c,(uint)(this->style == STYLE_HexenStrict));
        iVar6 = SBarInfoMainBlock::XOffset(block);
        iVar3 = SBarInfoMainBlock::YOffset(block);
        dVar10 = SBarInfoMainBlock::Alpha(block);
        bVar1 = SBarInfoMainBlock::FullScreenOffsets(block);
        DSBarInfo::DrawGraphic
                  (statusBar,pFVar9,SVar4,SVar5,iVar6,iVar3,dVar10,bVar1,false,_rx->Amount < 1,0,
                   false,-1,-1,nulclip,false);
      }
      pAVar7 = ::TObjPtr::operator_cast_to_AInventory_
                         ((TObjPtr *)&((statusBar->super_DBaseStatusBar).CPlayer)->mo->InvSel);
      if (_rx == pAVar7) {
        if (this->style == STYLE_Heretic) {
          pFVar9 = FImageCollection::operator[](&statusBar->Images,statusBar->invBarOffset + 1);
          SVar4 = local_48;
          SVar5 = SBarInfoCoordinate::operator+(&local_4c,0x1d);
          iVar6 = SBarInfoMainBlock::XOffset(block);
          iVar3 = SBarInfoMainBlock::YOffset(block);
          dVar10 = SBarInfoMainBlock::Alpha(block);
          bVar1 = SBarInfoMainBlock::FullScreenOffsets(block);
          DSBarInfo::DrawGraphic
                    (statusBar,pFVar9,SVar4,SVar5,iVar6,iVar3,dVar10,bVar1,false,false,0,false,-1,-1
                     ,nulclip,false);
        }
        else if (this->style == STYLE_Hexen) {
          pFVar9 = FImageCollection::operator[](&statusBar->Images,statusBar->invBarOffset + 1);
          SVar4 = local_48;
          SVar5 = SBarInfoCoordinate::operator-(&local_4c,1);
          iVar6 = SBarInfoMainBlock::XOffset(block);
          iVar3 = SBarInfoMainBlock::YOffset(block);
          dVar10 = SBarInfoMainBlock::Alpha(block);
          bVar1 = SBarInfoMainBlock::FullScreenOffsets(block);
          DSBarInfo::DrawGraphic
                    (statusBar,pFVar9,SVar4,SVar5,iVar6,iVar3,dVar10,bVar1,false,false,0,false,-1,-1
                     ,nulclip,false);
        }
        else if (this->style == STYLE_HexenStrict) {
          pFVar9 = FImageCollection::operator[](&statusBar->Images,statusBar->invBarOffset + 1);
          SVar4 = SBarInfoCoordinate::operator-(&local_48,1);
          SVar5 = SBarInfoCoordinate::operator-(&local_4c,1);
          iVar6 = SBarInfoMainBlock::XOffset(block);
          iVar3 = SBarInfoMainBlock::YOffset(block);
          dVar10 = SBarInfoMainBlock::Alpha(block);
          bVar1 = SBarInfoMainBlock::FullScreenOffsets(block);
          DSBarInfo::DrawGraphic
                    (statusBar,pFVar9,SVar4,SVar5,iVar6,iVar3,dVar10,bVar1,false,false,0,false,-1,-1
                     ,nulclip,false);
        }
        else if (this->style == STYLE_Strife) {
          pFVar9 = FImageCollection::operator[](&statusBar->Images,statusBar->invBarOffset + 2);
          SVar4 = SBarInfoCoordinate::operator-(&local_48,6);
          SVar5 = SBarInfoCoordinate::operator-(&local_4c,2);
          iVar6 = SBarInfoMainBlock::XOffset(block);
          iVar3 = SBarInfoMainBlock::YOffset(block);
          dVar10 = SBarInfoMainBlock::Alpha(block);
          bVar1 = SBarInfoMainBlock::FullScreenOffsets(block);
          DSBarInfo::DrawGraphic
                    (statusBar,pFVar9,SVar4,SVar5,iVar6,iVar3,dVar10,bVar1,false,false,0,false,-1,-1
                     ,nulclip,false);
        }
        else {
          pFVar9 = FImageCollection::operator[](&statusBar->Images,statusBar->invBarOffset + 1);
          SVar5 = local_48;
          SVar4 = local_4c;
          iVar6 = SBarInfoMainBlock::XOffset(block);
          iVar3 = SBarInfoMainBlock::YOffset(block);
          dVar10 = SBarInfoMainBlock::Alpha(block);
          bVar1 = SBarInfoMainBlock::FullScreenOffsets(block);
          DSBarInfo::DrawGraphic
                    (statusBar,pFVar9,SVar5,SVar4,iVar6,iVar3,dVar10,bVar1,false,false,0,false,-1,-1
                     ,nulclip,false);
        }
      }
      if (this->style == STYLE_Strife) {
        pFVar9 = FTextureManager::operator()(&TexMan,(FTextureID)(_rx->Icon).texnum,false);
        SVar5 = local_48;
        SVar4 = local_4c;
        iVar6 = SBarInfoMainBlock::XOffset(block);
        iVar3 = SBarInfoMainBlock::YOffset(block);
        dVar10 = SBarInfoMainBlock::Alpha(block);
        bVar1 = SBarInfoMainBlock::FullScreenOffsets(block);
        DSBarInfo::DrawGraphic
                  (statusBar,pFVar9,SVar5,SVar4,iVar6,iVar3,dVar10,bVar1,false,_rx->Amount < 1,0,
                   false,-1,-1,nulclip,false);
      }
      if ((this->counters != (CommandDrawNumber **)0x0) &&
         (((this->alwaysShowCounter & 1U) != 0 || (_rx->Amount != 1)))) {
        (this->counters[(uint)ry]->super_CommandDrawString).valueArgument = _rx->Amount;
        (*(this->counters[(uint)ry]->super_CommandDrawString).super_SBarInfoCommand.
          _vptr_SBarInfoCommand[2])(this->counters[(uint)ry],block,statusBar);
      }
      _rx = AInventory::NextInv(_rx);
      ry = (SBarInfoCoordinate)((int)ry + 1);
    }
    while( true ) {
      local_239 = 0;
      if ((uint)ry < this->size) {
        local_239 = this->noArtibox ^ 0xff;
      }
      if ((local_239 & 1) == 0) break;
      pFVar9 = FImageCollection::operator[](&statusBar->Images,statusBar->invBarOffset);
      if ((this->vertical & 1U) == 0) {
        local_25c = (int)ry * iVar2;
      }
      else {
        local_25c = 0;
      }
      SVar4 = SBarInfoCoordinate::operator+(&this->x,local_25c);
      if ((this->vertical & 1U) == 0) {
        local_26c = 0;
      }
      else {
        local_26c = (int)ry * iVar2;
      }
      SVar5 = SBarInfoCoordinate::operator+(&this->y,local_26c);
      iVar6 = SBarInfoMainBlock::XOffset(block);
      iVar3 = SBarInfoMainBlock::YOffset(block);
      bVar1 = SBarInfoMainBlock::FullScreenOffsets(block);
      DSBarInfo::DrawGraphic
                (statusBar,pFVar9,SVar4,SVar5,iVar6,iVar3,(double)item,bVar1,false,false,0,false,-1,
                 -1,nulclip,false);
      ry = (SBarInfoCoordinate)((int)ry + 1);
    }
    if ((this->noArrows & 1U) == 0) {
      pAVar7 = AActor::FirstInv(&((statusBar->super_DBaseStatusBar).CPlayer)->mo->super_AActor);
      pAVar8 = ::TObjPtr::operator_cast_to_AInventory_
                         ((TObjPtr *)&((statusBar->super_DBaseStatusBar).CPlayer)->mo->InvFirst);
      if (pAVar7 != pAVar8) {
        if (this->style == STYLE_Strife) {
          local_294 = 0xe;
        }
        else {
          local_294 = -10;
          if (this->style != STYLE_HexenStrict) {
            local_294 = -0xc;
          }
        }
        local_2d4 = -1;
        if (this->style != STYLE_HexenStrict) {
          local_2d4 = 0;
        }
        if ((gametic & 4U) == 0) {
          local_2ac = statusBar->invBarOffset + 3;
        }
        else {
          local_2ac = statusBar->invBarOffset + 4;
        }
        pFVar9 = FImageCollection::operator[](&statusBar->Images,local_2ac);
        local_2c4 = local_2d4;
        if ((this->vertical & 1U) == 0) {
          local_2c4 = local_294;
        }
        SVar4 = SBarInfoCoordinate::operator+(&this->x,local_2c4);
        if ((this->vertical & 1U) != 0) {
          local_2d4 = local_294;
        }
        SVar5 = SBarInfoCoordinate::operator+(&this->y,local_2d4);
        iVar2 = SBarInfoMainBlock::XOffset(block);
        iVar6 = SBarInfoMainBlock::YOffset(block);
        dVar10 = SBarInfoMainBlock::Alpha(block);
        bVar1 = SBarInfoMainBlock::FullScreenOffsets(block);
        DSBarInfo::DrawGraphic
                  (statusBar,pFVar9,SVar4,SVar5,iVar2,iVar6,dVar10,bVar1,false,false,0,false,-1,-1,
                   nulclip,false);
      }
    }
    if (((this->noArrows & 1U) == 0) && (_rx != (AInventory *)0x0)) {
      if (this->style == STYLE_Strife) {
        local_2f8 = this->size * 0x23 + -4;
      }
      else {
        if (this->style == STYLE_HexenStrict) {
          local_2f4 = this->size * 0x1f;
        }
        else {
          local_2f4 = this->size * 0x1f + 2;
        }
        local_2f8 = local_2f4;
      }
      local_334 = -1;
      if (this->style != STYLE_HexenStrict) {
        local_334 = 0;
      }
      if ((gametic & 4U) == 0) {
        local_30c = statusBar->invBarOffset + 5;
      }
      else {
        local_30c = statusBar->invBarOffset + 6;
      }
      pFVar9 = FImageCollection::operator[](&statusBar->Images,local_30c);
      local_324 = local_334;
      if ((this->vertical & 1U) == 0) {
        local_324 = local_2f8;
      }
      SVar4 = SBarInfoCoordinate::operator+(&this->x,local_324);
      if ((this->vertical & 1U) != 0) {
        local_334 = local_2f8;
      }
      SVar5 = SBarInfoCoordinate::operator+(&this->y,local_334);
      iVar2 = SBarInfoMainBlock::XOffset(block);
      iVar6 = SBarInfoMainBlock::YOffset(block);
      dVar10 = SBarInfoMainBlock::Alpha(block);
      bVar1 = SBarInfoMainBlock::FullScreenOffsets(block);
      DSBarInfo::DrawGraphic
                (statusBar,pFVar9,SVar4,SVar5,iVar2,iVar6,dVar10,bVar1,false,false,0,false,-1,-1,
                 nulclip,false);
    }
  }
  return;
}

Assistant:

void	Draw(const SBarInfoMainBlock *block, const DSBarInfo *statusBar)
		{
			int spacing = GetCounterSpacing(statusBar);
		
			double bgalpha = block->Alpha();
			if(translucent)
				bgalpha *= HX_SHADOW;
		
			AInventory *item;
			unsigned int i = 0;
			// If the player has no artifacts, don't draw the bar
			statusBar->CPlayer->mo->InvFirst = statusBar->ValidateInvFirst(size);
			if(statusBar->CPlayer->mo->InvFirst != NULL || alwaysShow)
			{
				for(item = statusBar->CPlayer->mo->InvFirst, i = 0; item != NULL && i < size; item = item->NextInv(), ++i)
				{
					SBarInfoCoordinate rx = x + (!vertical ? i*spacing : 0);
					SBarInfoCoordinate ry = y + (vertical ? i*spacing : 0);
					if(!noArtibox)
						statusBar->DrawGraphic(statusBar->Images[statusBar->invBarOffset + imgARTIBOX], rx, ry, block->XOffset(), block->YOffset(), bgalpha, block->FullScreenOffsets());
		
					if(style != STYLE_Strife) //Strife draws the cursor before the icons
						statusBar->DrawGraphic(TexMan(item->Icon), rx - (style == STYLE_HexenStrict ? 2 : 0), ry - (style == STYLE_HexenStrict ? 1 : 0), block->XOffset(), block->YOffset(), block->Alpha(), block->FullScreenOffsets(), false, item->Amount <= 0);
					if(item == statusBar->CPlayer->mo->InvSel)
					{
						if(style == STYLE_Heretic)
							statusBar->DrawGraphic(statusBar->Images[statusBar->invBarOffset + imgSELECTBOX], rx, ry+29, block->XOffset(), block->YOffset(), block->Alpha(), block->FullScreenOffsets());
						else if(style == STYLE_Hexen)
							statusBar->DrawGraphic(statusBar->Images[statusBar->invBarOffset + imgSELECTBOX], rx, ry-1, block->XOffset(), block->YOffset(), block->Alpha(), block->FullScreenOffsets());
						else if(style == STYLE_HexenStrict)
							statusBar->DrawGraphic(statusBar->Images[statusBar->invBarOffset + imgSELECTBOX], rx-1, ry-1, block->XOffset(), block->YOffset(), block->Alpha(), block->FullScreenOffsets());
						else if(style == STYLE_Strife)
							statusBar->DrawGraphic(statusBar->Images[statusBar->invBarOffset + imgCURSOR], rx-6, ry-2, block->XOffset(), block->YOffset(), block->Alpha(), block->FullScreenOffsets());
						else
							statusBar->DrawGraphic(statusBar->Images[statusBar->invBarOffset + imgSELECTBOX], rx, ry, block->XOffset(), block->YOffset(), block->Alpha(), block->FullScreenOffsets());
					}
					if(style == STYLE_Strife)
						statusBar->DrawGraphic(TexMan(item->Icon), rx, ry, block->XOffset(), block->YOffset(), block->Alpha(), block->FullScreenOffsets(), false, item->Amount <= 0);
					if(counters != NULL && (alwaysShowCounter || item->Amount != 1))
					{
						counters[i]->valueArgument = item->Amount;
						counters[i]->Draw(block, statusBar);
					}
				}
				for (; i < size && !noArtibox; ++i)
					statusBar->DrawGraphic(statusBar->Images[statusBar->invBarOffset + imgARTIBOX], x + (!vertical ? (i*spacing) : 0), y + (vertical ? (i*spacing) : 0), block->XOffset(), block->YOffset(), bgalpha, block->FullScreenOffsets());
		
				// Is there something to the left?
				if (!noArrows && statusBar->CPlayer->mo->FirstInv() != statusBar->CPlayer->mo->InvFirst)
				{
					int offset = (style != STYLE_Strife ? (style != STYLE_HexenStrict ? -12 : -10) : 14);
					int yOffset = style != STYLE_HexenStrict ? 0 : -1;
					statusBar->DrawGraphic(statusBar->Images[!(gametic & 4) ?
						statusBar->invBarOffset + imgINVLFGEM1 : statusBar->invBarOffset + imgINVLFGEM2], x + (!vertical ? offset : yOffset), y + (vertical ? offset : yOffset), block->XOffset(), block->YOffset(), block->Alpha(), block->FullScreenOffsets());
				}
				// Is there something to the right?
				if (!noArrows && item != NULL)
				{
					int offset = (style != STYLE_Strife ? (style != STYLE_HexenStrict ? size*31+2 : size*31) : size*35-4);
					int yOffset = style != STYLE_HexenStrict ? 0 : -1;
					statusBar->DrawGraphic(statusBar->Images[!(gametic & 4) ?
						statusBar->invBarOffset + imgINVRTGEM1 : statusBar->invBarOffset + imgINVRTGEM2], x + (!vertical ? offset : yOffset), y + (vertical ? offset : yOffset), block->XOffset(), block->YOffset(), block->Alpha(), block->FullScreenOffsets());
				}
			}
		}